

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

ON_SubDHashType ON_SubDHashTypeFromUnsigned(uint subd_hash_type_as_unsigned)

{
  ON_SubDHashType local_9;
  uint subd_hash_type_as_unsigned_local;
  
  switch(subd_hash_type_as_unsigned) {
  case 0:
    local_9 = Unset;
    break;
  case 1:
    local_9 = TopologyAndEdgeCreases;
    break;
  case 2:
    local_9 = Geometry;
    break;
  case 3:
    local_9 = Topology;
    break;
  default:
    ON_SubDIncrementErrorCount();
    local_9 = Unset;
  }
  return local_9;
}

Assistant:

ON_SubDHashType ON_SubDHashTypeFromUnsigned(
  unsigned int subd_hash_type_as_unsigned
)
{
  switch (subd_hash_type_as_unsigned)
  {
    ON_ENUM_FROM_UNSIGNED_CASE(ON_SubDHashType::Unset);
    ON_ENUM_FROM_UNSIGNED_CASE(ON_SubDHashType::Topology);
    ON_ENUM_FROM_UNSIGNED_CASE(ON_SubDHashType::TopologyAndEdgeCreases);
    ON_ENUM_FROM_UNSIGNED_CASE(ON_SubDHashType::Geometry);
  }
  return ON_SUBD_RETURN_ERROR(ON_SubDHashType::Unset);
}